

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O1

FT_Error ps_unicodes_init(FT_Memory memory,PS_Unicodes table,FT_UInt num_glyphs,
                         PS_GetGlyphNameFunc get_glyph_name,PS_FreeGlyphNameFunc free_glyph_name,
                         FT_Pointer glyph_data)

{
  PS_UniMap *P;
  PS_Unicodes pPVar1;
  int iVar2;
  FT_UInt32 FVar3;
  PS_UniMap *pPVar4;
  char *__s2;
  FT_UInt FVar5;
  long lVar6;
  ulong new_count;
  uint uVar7;
  ulong uVar8;
  FT_Error error;
  FT_UInt extra_glyph_list_states [10];
  FT_UInt extra_glyphs [10];
  FT_Error local_c4;
  FT_Pointer local_c0;
  PS_GetGlyphNameFunc local_b8;
  ulong local_b0;
  PS_FreeGlyphNameFunc local_a8;
  ulong local_a0;
  FT_Memory local_98;
  PS_Unicodes local_90;
  int local_88 [12];
  FT_UInt aFStack_58 [10];
  
  uVar8 = (ulong)num_glyphs;
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[6] = 0;
  local_88[7] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[8] = 0;
  local_88[9] = 0;
  table->num_maps = 0;
  new_count = (ulong)(num_glyphs + 10);
  local_c0 = glyph_data;
  local_b8 = get_glyph_name;
  local_a8 = free_glyph_name;
  pPVar4 = (PS_UniMap *)ft_mem_qrealloc(memory,8,0,new_count,(void *)0x0,&local_c4);
  table->maps = pPVar4;
  if (local_c4 == 0) {
    local_a0 = new_count;
    local_98 = memory;
    local_90 = table;
    if (num_glyphs != 0) {
      FVar5 = 0;
      local_b0 = uVar8;
      do {
        __s2 = (*local_b8)(local_c0,FVar5);
        if ((__s2 != (char *)0x0) && (*__s2 != '\0')) {
          lVar6 = 0;
          do {
            iVar2 = strcmp("Delta" + *(int *)((long)ft_extra_glyph_name_offsets + lVar6),__s2);
            if (iVar2 == 0) {
              if (*(int *)((long)local_88 + lVar6) == 0) {
                *(undefined4 *)((long)local_88 + lVar6) = 1;
                *(FT_UInt *)((long)aFStack_58 + lVar6) = FVar5;
              }
              break;
            }
            lVar6 = lVar6 + 4;
          } while (lVar6 != 0x28);
          FVar3 = ps_unicode_value(__s2);
          uVar8 = local_b0;
          if ((FVar3 & 0x7fffffff) != 0) {
            lVar6 = 0;
            do {
              if (*(FT_UInt32 *)((long)ft_extra_glyph_unicodes + lVar6) == FVar3) {
                *(undefined4 *)((long)local_88 + lVar6) = 2;
                break;
              }
              lVar6 = lVar6 + 4;
            } while (lVar6 != 0x28);
            pPVar4->unicode = FVar3;
            pPVar4->glyph_index = FVar5;
            pPVar4 = pPVar4 + 1;
          }
          if (local_a8 != (PS_FreeGlyphNameFunc)0x0) {
            (*local_a8)(local_c0,__s2);
          }
        }
        FVar5 = FVar5 + 1;
        num_glyphs = (FT_UInt)uVar8;
      } while (FVar5 != num_glyphs);
    }
    pPVar1 = local_90;
    lVar6 = 0;
    do {
      if (*(int *)((long)local_88 + lVar6) == 1) {
        pPVar4->unicode = *(FT_UInt32 *)((long)ft_extra_glyph_unicodes + lVar6);
        pPVar4->glyph_index = *(FT_UInt *)((long)aFStack_58 + lVar6);
        pPVar4 = pPVar4 + 1;
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x28);
    P = local_90->maps;
    uVar8 = (ulong)((long)pPVar4 - (long)P) >> 3;
    uVar7 = (uint)uVar8;
    if (uVar7 == 0) {
      ft_mem_free(local_98,P);
      pPVar1->maps = (PS_UniMap *)0x0;
      if (local_c4 == 0) {
        local_c4 = 0xa3;
      }
    }
    else {
      if (uVar7 < num_glyphs >> 1) {
        pPVar4 = (PS_UniMap *)ft_mem_qrealloc(local_98,8,local_a0,uVar8 & 0xffffffff,P,&local_c4);
        pPVar1->maps = pPVar4;
        local_c4 = 0;
      }
      qsort(pPVar1->maps,uVar8 & 0xffffffff,8,compare_uni_maps);
    }
    pPVar1->num_maps = uVar7;
  }
  return local_c4;
}

Assistant:

static FT_Error
  ps_unicodes_init( FT_Memory             memory,
                    PS_Unicodes           table,
                    FT_UInt               num_glyphs,
                    PS_GetGlyphNameFunc   get_glyph_name,
                    PS_FreeGlyphNameFunc  free_glyph_name,
                    FT_Pointer            glyph_data )
  {
    FT_Error  error;

    FT_UInt  extra_glyph_list_states[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
    FT_UInt  extra_glyphs[EXTRA_GLYPH_LIST_SIZE];


    /* we first allocate the table */
    table->num_maps = 0;

    if ( !FT_QNEW_ARRAY( table->maps, num_glyphs + EXTRA_GLYPH_LIST_SIZE ) )
    {
      FT_UInt     n;
      FT_UInt     count;
      PS_UniMap*  map;
      FT_UInt32   uni_char;


      map = table->maps;

      for ( n = 0; n < num_glyphs; n++ )
      {
        const char*  gname = get_glyph_name( glyph_data, n );


        if ( gname && *gname )
        {
          ps_check_extra_glyph_name( gname, n,
                                     extra_glyphs, extra_glyph_list_states );
          uni_char = ps_unicode_value( gname );

          if ( BASE_GLYPH( uni_char ) != 0 )
          {
            ps_check_extra_glyph_unicode( uni_char,
                                          extra_glyph_list_states );
            map->unicode     = uni_char;
            map->glyph_index = n;
            map++;
          }

          if ( free_glyph_name )
            free_glyph_name( glyph_data, gname );
        }
      }

      for ( n = 0; n < EXTRA_GLYPH_LIST_SIZE; n++ )
      {
        if ( extra_glyph_list_states[n] == 1 )
        {
          /* This glyph name has an additional representation. */
          /* Add it to the cmap.                               */

          map->unicode     = ft_extra_glyph_unicodes[n];
          map->glyph_index = extra_glyphs[n];
          map++;
        }
      }

      /* now compress the table a bit */
      count = (FT_UInt)( map - table->maps );

      if ( count == 0 )
      {
        /* No unicode chars here! */
        FT_FREE( table->maps );
        if ( !error )
          error = FT_THROW( No_Unicode_Glyph_Name );
      }
      else
      {
        /* Reallocate if the number of used entries is much smaller. */
        if ( count < num_glyphs / 2 )
        {
          FT_MEM_QRENEW_ARRAY( table->maps,
                               num_glyphs + EXTRA_GLYPH_LIST_SIZE,
                               count );
          error = FT_Err_Ok;
        }

        /* Sort the table in increasing order of unicode values, */
        /* taking care of glyph variants.                        */
        ft_qsort( table->maps, count, sizeof ( PS_UniMap ),
                  compare_uni_maps );
      }

      table->num_maps = count;
    }

    return error;
  }